

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualNaN_Test::~Equality_unitsNotEqualNaN_Test
          (Equality_unitsNotEqualNaN_Test *this)

{
  Equality_unitsNotEqualNaN_Test *this_local;
  
  ~Equality_unitsNotEqualNaN_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualNaN)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", std::numeric_limits<double>::quiet_NaN());
    u2->addUnit("second", 2.0);

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}